

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::SpecifyConditionVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (SpecifyConditionVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  bool bVar3;
  ExpressionKind EVar4;
  ulong uVar5;
  Symbol *pSVar6;
  Diagnostic *this_01;
  long lVar7;
  
  bVar3 = Expression::bad((Expression *)expr);
  if (bVar3) {
    return;
  }
  EVar4 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  uVar5 = (ulong)EVar4;
  if (uVar5 < 0x26) {
    if ((0x20006d9c00U >> (uVar5 & 0x3f) & 1) == 0) {
      if ((6UL >> (uVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar5 == 8) {
        pSVar6 = Expression::getSymbolReference((Expression *)expr,true);
        if (pSVar6 == (Symbol *)0x0) {
          return;
        }
        if (pSVar6->kind - Net < 2) {
          if (pSVar6->parentScope == this->specifyParentScope) {
            return;
          }
        }
        else if (pSVar6->kind == Specparam) {
          return;
        }
        this_01 = ASTContext::addDiag(this->context,(DiagCode)0x980007,
                                      (expr->super_AssignmentPatternExpressionBase).super_Expression
                                      .sourceRange);
        Diagnostic::operator<<(this_01,pSVar6->name);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,pSVar6->location);
        return;
      }
    }
    else {
      sVar1 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
      if (sVar1 != 0) {
        ppEVar2 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
        lVar7 = 0;
        do {
          this_00 = *(Expression **)((long)ppEVar2 + lVar7);
          Expression::
          visitExpression<slang::ast::Expression_const,slang::ast::SpecifyConditionVisitor&>
                    (this_00,this_00,this);
          lVar7 = lVar7 + 8;
        } while (sVar1 << 3 != lVar7);
        EVar4 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
      }
      if (EVar4 == Conversion) {
        if (*(int *)&(expr->super_AssignmentPatternExpressionBase).elements_._M_ptr < 2) {
          return;
        }
      }
      else if (EVar4 == BinaryOp) {
        if (*(int *)&expr->isLValue - 5U < 6) {
          return;
        }
        if (*(int *)&expr->isLValue - 0x13U < 2) {
          return;
        }
      }
      else {
        if (EVar4 != UnaryOp) {
          return;
        }
        if (*(int *)&(expr->super_AssignmentPatternExpressionBase).elements_._M_ptr - 2U < 8) {
          return;
        }
      }
    }
  }
  if (this->hasWarned == false) {
    ASTContext::addDiag(this->context,(DiagCode)0xd60007,
                        (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
    this->hasWarned = true;
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.bad())
                return;

            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        // Specparams are always allowed.
                        if (sym->kind == SymbolKind::Specparam)
                            break;

                        // Other references must be locally defined nets or variables.
                        if ((sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) ||
                            sym->getParentScope() != specifyParentScope) {
                            auto& diag = context.addDiag(diag::SpecifyPathBadReference,
                                                         expr.sourceRange);
                            diag << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect:
                case ExpressionKind::Call:
                case ExpressionKind::MinTypMax:
                case ExpressionKind::Concatenation:
                case ExpressionKind::Replication:
                case ExpressionKind::ConditionalOp:
                case ExpressionKind::UnaryOp:
                case ExpressionKind::BinaryOp:
                case ExpressionKind::Conversion:
                    if constexpr (HasVisitExprs<T, SpecifyConditionVisitor>)
                        expr.visitExprs(*this);

                    if (expr.kind == ExpressionKind::UnaryOp) {
                        switch (expr.template as<UnaryExpression>().op) {
                            case UnaryOperator::BitwiseNot:
                            case UnaryOperator::BitwiseAnd:
                            case UnaryOperator::BitwiseOr:
                            case UnaryOperator::BitwiseXor:
                            case UnaryOperator::BitwiseNand:
                            case UnaryOperator::BitwiseNor:
                            case UnaryOperator::BitwiseXnor:
                            case UnaryOperator::LogicalNot:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::BinaryOp) {
                        switch (expr.template as<BinaryExpression>().op) {
                            case BinaryOperator::BinaryAnd:
                            case BinaryOperator::BinaryOr:
                            case BinaryOperator::BinaryXor:
                            case BinaryOperator::BinaryXnor:
                            case BinaryOperator::Equality:
                            case BinaryOperator::Inequality:
                            case BinaryOperator::LogicalAnd:
                            case BinaryOperator::LogicalOr:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::Conversion) {
                        if (!expr.template as<ConversionExpression>().isImplicit())
                            reportError(expr.sourceRange);
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                case ExpressionKind::RealLiteral:
                    break;
                default:
                    reportError(expr.sourceRange);
                    break;
            }
        }
    }